

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndComboPreview(void)

{
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  float fVar2;
  ImGuiContext *pIVar3;
  ImGuiComboPreviewData *pIVar4;
  ImDrawCmd *pIVar5;
  ImVec2 IVar6;
  ImDrawList *draw_list;
  ImGuiComboPreviewData *preview_data;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImDrawCmd *in_stack_ffffffffffffffc0;
  ImVec2 in_stack_ffffffffffffffc8;
  ImVec2 in_stack_ffffffffffffffd0;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar4 = &GImGui->ComboPreviewData;
  this = pIVar1->DrawList;
  if ((((pIVar1->DC).CursorMaxPos.x < (GImGui->ComboPreviewData).PreviewRect.Max.x) &&
      ((pIVar1->DC).CursorMaxPos.y < (GImGui->ComboPreviewData).PreviewRect.Max.y)) &&
     (1 < (this->CmdBuffer).Size)) {
    in_stack_ffffffffffffffc0 =
         ImVector<ImDrawCmd>::operator[](&this->CmdBuffer,(this->CmdBuffer).Size + -2);
    pIVar5 = ImVector<ImDrawCmd>::operator[](&this->CmdBuffer,(this->CmdBuffer).Size + -1);
    fVar2 = (in_stack_ffffffffffffffc0->ClipRect).y;
    (pIVar5->ClipRect).x = (in_stack_ffffffffffffffc0->ClipRect).x;
    (pIVar5->ClipRect).y = fVar2;
    fVar2 = (in_stack_ffffffffffffffc0->ClipRect).w;
    (pIVar5->ClipRect).z = (in_stack_ffffffffffffffc0->ClipRect).z;
    (pIVar5->ClipRect).w = fVar2;
    fVar2 = (pIVar5->ClipRect).y;
    (this->_CmdHeader).ClipRect.x = (pIVar5->ClipRect).x;
    (this->_CmdHeader).ClipRect.y = fVar2;
    fVar2 = (pIVar5->ClipRect).w;
    (this->_CmdHeader).ClipRect.z = (pIVar5->ClipRect).z;
    (this->_CmdHeader).ClipRect.w = fVar2;
    ImDrawList::_TryMergeDrawCmds((ImDrawList *)in_stack_ffffffffffffffd0);
  }
  PopClipRect();
  (pIVar1->DC).CursorPos = (pIVar3->ComboPreviewData).BackupCursorPos;
  IVar6 = ImMax((ImVec2 *)in_stack_ffffffffffffffc8,(ImVec2 *)in_stack_ffffffffffffffc0);
  (pIVar1->DC).CursorMaxPos = IVar6;
  (pIVar1->DC).CursorPosPrevLine = (pIVar3->ComboPreviewData).BackupCursorPosPrevLine;
  (pIVar1->DC).PrevLineTextBaseOffset = (pIVar3->ComboPreviewData).BackupPrevLineTextBaseOffset;
  (pIVar1->DC).LayoutType = (pIVar3->ComboPreviewData).BackupLayout;
  (pIVar1->DC).IsSameLine = false;
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffffc0);
  (pIVar4->PreviewRect).Min = in_stack_ffffffffffffffc8;
  (pIVar3->ComboPreviewData).PreviewRect.Max = in_stack_ffffffffffffffd0;
  return;
}

Assistant:

void ImGui::EndComboPreview()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiComboPreviewData* preview_data = &g.ComboPreviewData;

    // FIXME: Using CursorMaxPos approximation instead of correct AABB which we will store in ImDrawCmd in the future
    ImDrawList* draw_list = window->DrawList;
    if (window->DC.CursorMaxPos.x < preview_data->PreviewRect.Max.x && window->DC.CursorMaxPos.y < preview_data->PreviewRect.Max.y)
        if (draw_list->CmdBuffer.Size > 1) // Unlikely case that the PushClipRect() didn't create a command
        {
            draw_list->_CmdHeader.ClipRect = draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ClipRect = draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 2].ClipRect;
            draw_list->_TryMergeDrawCmds();
        }
    PopClipRect();
    window->DC.CursorPos = preview_data->BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(window->DC.CursorMaxPos, preview_data->BackupCursorMaxPos);
    window->DC.CursorPosPrevLine = preview_data->BackupCursorPosPrevLine;
    window->DC.PrevLineTextBaseOffset = preview_data->BackupPrevLineTextBaseOffset;
    window->DC.LayoutType = preview_data->BackupLayout;
    window->DC.IsSameLine = false;
    preview_data->PreviewRect = ImRect();
}